

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O0

void write_to_register(ymz280b_state *chip,UINT8 data)

{
  YMZ280BVoice *voice_00;
  UINT8 UVar1;
  uint uVar2;
  int local_24;
  int i;
  YMZ280BVoice *voice;
  UINT8 data_local;
  ymz280b_state *chip_local;
  
  if (chip->current_register < 0x80) {
    uVar2._0_1_ = chip->current_register;
    uVar2._1_1_ = chip->status_register;
    uVar2._2_1_ = chip->irq_state;
    uVar2._3_1_ = chip->irq_mask;
    voice_00 = chip->voice + (uVar2 >> 2 & 7);
    switch(chip->current_register & 0xe3) {
    case 0:
      voice_00->fnum = voice_00->fnum & 0x100 | (ushort)data;
      update_step(chip,voice_00);
      break;
    case 1:
      voice_00->fnum = voice_00->fnum & 0xff | (data & 1) << 8;
      voice_00->looping = (UINT8)((int)(data & 0x10) >> 4);
      if ((data & 0x60) == 0) {
        voice._7_1_ = 0;
      }
      else {
        voice_00->mode = (UINT8)((int)(data & 0x60) >> 5);
        voice._7_1_ = data;
      }
      if (((voice_00->keyon == '\0') && ((voice._7_1_ & 0x80) != 0)) && (chip->keyon_enable != '\0')
         ) {
        voice_00->playing = '\x01';
        voice_00->position = voice_00->start;
        voice_00->loop_signal = 0;
        voice_00->signal = 0;
        voice_00->loop_step = 0x7f;
        voice_00->step = 0x7f;
        voice_00->loop_count = 0;
        voice_00->irq_schedule = '\0';
      }
      else if ((voice_00->keyon != '\0') && ((voice._7_1_ & 0x80) == 0)) {
        voice_00->playing = '\0';
        voice_00->irq_schedule = '\0';
      }
      voice_00->keyon = (UINT8)((int)(voice._7_1_ & 0x80) >> 7);
      update_step(chip,voice_00);
      break;
    case 2:
      voice_00->level = data;
      update_volumes(voice_00);
      break;
    case 3:
      voice_00->pan = data & 0xf;
      update_volumes(voice_00);
      break;
    default:
      emu_logf(&chip->logger,'\x04',"unknown register write %02X = %02X\n",
               (ulong)chip->current_register,(ulong)data);
      break;
    case 0x20:
      voice_00->start = voice_00->start & 0x1fffe | (uint)data << 0x11;
      break;
    case 0x21:
      voice_00->loop_start = voice_00->loop_start & 0x1fffe | (uint)data << 0x11;
      break;
    case 0x22:
      voice_00->loop_end = voice_00->loop_end & 0x1fffe | (uint)data << 0x11;
      break;
    case 0x23:
      voice_00->stop = voice_00->stop & 0x1fffe | (uint)data << 0x11;
      break;
    case 0x40:
      voice_00->start = voice_00->start & 0x1fe01fe | (uint)data << 9;
      break;
    case 0x41:
      voice_00->loop_start = voice_00->loop_start & 0x1fe01fe | (uint)data << 9;
      break;
    case 0x42:
      voice_00->loop_end = voice_00->loop_end & 0x1fe01fe | (uint)data << 9;
      break;
    case 0x43:
      voice_00->stop = voice_00->stop & 0x1fe01fe | (uint)data << 9;
      break;
    case 0x60:
      voice_00->start = voice_00->start & 0x1fffe00 | (uint)data << 1;
      break;
    case 0x61:
      voice_00->loop_start = voice_00->loop_start & 0x1fffe00 | (uint)data << 1;
      break;
    case 0x62:
      voice_00->loop_end = voice_00->loop_end & 0x1fffe00 | (uint)data << 1;
      break;
    case 99:
      voice_00->stop = voice_00->stop & 0x1fffe00 | (uint)data << 1;
    }
  }
  else {
    uVar2 = (uint)chip->current_register;
    if (uVar2 - 0x80 < 3) {
      emu_logf(&chip->logger,'\x04',"DSP register write %02X = %02X\n",(ulong)chip->current_register
               ,(ulong)data);
    }
    else if (uVar2 == 0x84) {
      chip->ext_mem_address_hi = (uint)data << 0x10;
    }
    else if (uVar2 == 0x85) {
      chip->ext_mem_address_mid = (uint)data << 8;
    }
    else if (uVar2 == 0x86) {
      chip->ext_mem_address = chip->ext_mem_address_hi | chip->ext_mem_address_mid | (uint)data;
      if (chip->ext_mem_enable != '\0') {
        UVar1 = ymz280b_read_memory(chip,chip->ext_mem_address);
        chip->ext_readlatch = UVar1;
      }
    }
    else if (uVar2 == 0x87) {
      if (chip->ext_mem_enable != '\0') {
        if (chip->ext_write_handler != (_func_void_void_ptr_UINT32_UINT8 *)0x0) {
          (*chip->ext_write_handler)(chip->ext_param,chip->ext_mem_address,data);
        }
        chip->ext_mem_address = chip->ext_mem_address + 1 & 0xffffff;
      }
    }
    else if (uVar2 == 0xfe) {
      chip->irq_mask = data;
      update_irq_state(chip);
    }
    else if (uVar2 == 0xff) {
      chip->ext_mem_enable = (UINT8)((int)(data & 0x40) >> 6);
      chip->irq_enable = (UINT8)((int)(data & 0x10) >> 4);
      update_irq_state(chip);
      if ((chip->keyon_enable == '\0') || ((data & 0x80) != 0)) {
        if ((chip->keyon_enable == '\0') && ((data & 0x80) != 0)) {
          for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
            if ((chip->voice[local_24].keyon != '\0') && (chip->voice[local_24].looping != '\0')) {
              chip->voice[local_24].playing = '\x01';
            }
          }
        }
      }
      else {
        for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
          chip->voice[local_24].playing = '\0';
          chip->voice[local_24].irq_schedule = '\0';
        }
      }
      chip->keyon_enable = (UINT8)((int)(data & 0x80) >> 7);
    }
    else {
      emu_logf(&chip->logger,'\x04',"unknown register write %02X = %02X\n",
               (ulong)chip->current_register,(ulong)data);
    }
  }
  return;
}

Assistant:

static void write_to_register(ymz280b_state *chip, UINT8 data)
{
	struct YMZ280BVoice *voice;
	int i;

	/* lower registers follow a pattern */
	if (chip->current_register < 0x80)
	{
		voice = &chip->voice[(chip->current_register >> 2) & 7];

		switch (chip->current_register & 0xe3)
		{
			case 0x00:      /* pitch low 8 bits */
				voice->fnum = (voice->fnum & 0x100) | (data & 0xff);
				update_step(chip, voice);
				break;

			case 0x01:      /* pitch upper 1 bit, loop, key on, mode */
				voice->fnum = (voice->fnum & 0xff) | ((data & 0x01) << 8);
				voice->looping = (data & 0x10) >> 4;
				if ((data & 0x60) == 0) data &= 0x7f; /* ignore mode setting and set to same state as KON=0 */
				else voice->mode = (data & 0x60) >> 5;
				if (!voice->keyon && (data & 0x80) && chip->keyon_enable)
				{
					voice->playing = 1;
					voice->position = voice->start;
					voice->signal = voice->loop_signal = 0;
					voice->step = voice->loop_step = 0x7f;
					voice->loop_count = 0;

					/* if update_irq_state_timer is set, cancel it. */
					voice->irq_schedule = 0;
				}
				else if (voice->keyon && !(data & 0x80))
				{
					voice->playing = 0;

					// if update_irq_state_timer is set, cancel it.
					voice->irq_schedule = 0;
				}
				voice->keyon = (data & 0x80) >> 7;
				update_step(chip, voice);
				break;

			case 0x02:      /* total level */
				voice->level = data;
				update_volumes(voice);
				break;

			case 0x03:      /* pan */
				voice->pan = data & 0x0f;
				update_volumes(voice);
				break;

			case 0x20:      /* start address high */
				voice->start = (voice->start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x21:      /* loop start address high */
				voice->loop_start = (voice->loop_start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x22:      /* loop end address high */
				voice->loop_end = (voice->loop_end & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x23:      /* stop address high */
				voice->stop = (voice->stop & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x40:      /* start address middle */
				voice->start = (voice->start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x41:      /* loop start address middle */
				voice->loop_start = (voice->loop_start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x42:      /* loop end address middle */
				voice->loop_end = (voice->loop_end & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x43:      /* stop address middle */
				voice->stop = (voice->stop & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x60:      /* start address low */
				voice->start = (voice->start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x61:      /* loop start address low */
				voice->loop_start = (voice->loop_start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x62:      /* loop end address low */
				voice->loop_end = (voice->loop_end & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x63:      /* stop address low */
				voice->stop = (voice->stop & (0xffff00 << 1)) | (data << 1);
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}

	/* upper registers are special */
	else
	{
		switch (chip->current_register)
		{
			/* DSP related (not implemented yet) */
			case 0x80: // d0-2: DSP Rch, d3: enable Rch (0: yes, 1: no), d4-6: DSP Lch, d7: enable Lch (0: yes, 1: no)
			case 0x81: // d0: enable control of $82 (0: yes, 1: no)
			case 0x82: // DSP data
				emu_logf(&chip->logger, DEVLOG_DEBUG, "DSP register write %02X = %02X\n", chip->current_register, data);
				break;

			case 0x84:      /* ROM readback / RAM write (high) */
				chip->ext_mem_address_hi = data << 16;
				break;

			case 0x85:      /* ROM readback / RAM write (middle) */
				chip->ext_mem_address_mid = data << 8;
				break;

			case 0x86:      /* ROM readback / RAM write (low) -> update latch */
				chip->ext_mem_address = chip->ext_mem_address_hi | chip->ext_mem_address_mid | data;
				if (chip->ext_mem_enable)
					chip->ext_readlatch = ymz280b_read_memory(chip, chip->ext_mem_address);
				break;

			case 0x87:      /* RAM write */
				if (chip->ext_mem_enable)
				{
					if (chip->ext_write_handler != NULL)
						chip->ext_write_handler(chip->ext_param, chip->ext_mem_address, data);
					//else
					//	emu_logf(&chip->logger, DEVLOG_TRACE, "attempted RAM write to %X\n", chip->ext_mem_address);
					chip->ext_mem_address = (chip->ext_mem_address + 1) & 0xffffff;
				}
				break;

			case 0xfe:      /* IRQ mask */
				chip->irq_mask = data;
				update_irq_state(chip);
				break;

			case 0xff:      /* IRQ enable, test, etc */
				chip->ext_mem_enable = (data & 0x40) >> 6;
				chip->irq_enable = (data & 0x10) >> 4;
				update_irq_state(chip);

				if (chip->keyon_enable && !(data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						chip->voice[i].playing = 0;

						/* if update_irq_state_timer is set, cancel it. */
						chip->voice[i].irq_schedule = 0;
					}
				}
				else if (!chip->keyon_enable && (data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						if (chip->voice[i].keyon && chip->voice[i].looping)
							chip->voice[i].playing = 1;
					}
				}
				chip->keyon_enable = (data & 0x80) >> 7;
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}
}